

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<true>::PushElement<unsigned_int,unsigned_int>
          (FlatBufferBuilderImpl<true> *this,uint element)

{
  uint local_14;
  
  Align(this,4);
  vector_downward<unsigned_long>::push_small<unsigned_int>(&this->buf_,&local_14);
  return (int)(this->buf_).size_ - (int)this->length_of_64_bit_region_;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }